

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O2

JsErrorCode JsExternalizeArrayBuffer(JsValueRef arrayBufferVar)

{
  bool bVar1;
  JsErrorCode JVar2;
  JsrtContext *currentContext;
  ArrayBuffer *pAVar3;
  AutoNestedHandledExceptionType local_48 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (arrayBufferVar == (JsValueRef)0x0) {
    JVar2 = JsErrorInvalidArgument;
  }
  else {
    currentContext = JsrtContext::GetCurrent();
    JVar2 = CheckContext(currentContext,false,false);
    if (JVar2 == JsNoError) {
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      bVar1 = Js::VarIs<Js::ArrayBuffer>(arrayBufferVar);
      JVar2 = JsErrorInvalidArgument;
      if (bVar1) {
        pAVar3 = Js::UnsafeVarTo<Js::ArrayBuffer>(arrayBufferVar);
        if (pAVar3 != (ArrayBuffer *)0x0) {
          (pAVar3->super_ArrayBufferBase).externalized = true;
          JVar2 = JsNoError;
        }
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
    }
  }
  return JVar2;
}

Assistant:

CHAKRA_API
JsExternalizeArrayBuffer(
    _In_ JsValueRef arrayBufferVar)
{
    VALIDATE_JSREF(arrayBufferVar);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {

        Js::ArrayBuffer* arrayBuffer = Js::JavascriptOperators::TryFromVar<Js::ArrayBuffer>(arrayBufferVar);
        if (!arrayBuffer)
        {
            return JsErrorInvalidArgument;
        }

        arrayBuffer->Externalize();

        return JsNoError;
    });
}